

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

int __thiscall AddrManImpl::CheckAddrman(AddrManImpl *this)

{
  long lVar1;
  bool bVar2;
  strong_ordering sVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  rep rVar8;
  pointer pvVar9;
  reference pvVar10;
  size_type sVar11;
  size_type sVar12;
  mapped_type *pmVar13;
  size_type sVar14;
  size_type sVar15;
  type *ptVar16;
  mapped_type *pmVar17;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<long,_true,_false>,_bool> pVar18;
  type *count;
  type *net;
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  *__range1_1;
  int i_1;
  int n_2;
  int i;
  int n_1;
  AddrInfo *info;
  value_type *entry;
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  *__range1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator it_2;
  const_iterator it_1;
  const_iterator it;
  nid_type n;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  local_counts;
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  mapNew;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> setTried;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer2;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> in_stack_fffffffffffffc88
  ;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  int *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  allocator<char> *in_stack_fffffffffffffcb8;
  string *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  undefined1 fNew;
  int in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  _Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> in_stack_fffffffffffffcd8;
  seconds in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  strong_ordering in_stack_fffffffffffffd07;
  NodeSeconds *in_stack_fffffffffffffd08;
  seconds in_stack_fffffffffffffd10;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_20c;
  allocator<char> local_b9;
  _Node_iterator_base<long,_false> local_b8;
  undefined1 local_b0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffc88.__d.__r,
             (char *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
             in_stack_fffffffffffffc7c,(AnnotatedMixin<std::mutex> *)0x88270c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             (char *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::vector<long,_std::allocator<long>_>::size
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  tinyformat::format<int,int,unsigned_long>
            ((char *)in_stack_fffffffffffffcb8,
             (int *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
             in_stack_fffffffffffffca8,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
            ((Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
             CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             in_stack_fffffffffffffcc0,(LogFlags)in_stack_fffffffffffffcb8,
             SUB41((uint)in_stack_fffffffffffffcb4 >> 0x18,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::allocator<char>::~allocator(&local_b9);
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
                CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  ::unordered_map((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                   *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  ::unordered_map((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                   *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  sVar6 = std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)
                     CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  if (sVar6 == (long)(*(int *)(in_RDI + 0x170) + *(int *)(in_RDI + 0x20178))) {
    std::
    unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
    ::begin((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
             *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
    std::
    unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
    ::end((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
           *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
    while (bVar2 = std::__detail::operator==
                             ((_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                              in_stack_fffffffffffffc88.__d.__r,
                              (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                              CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar7 = std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
               operator*((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                         CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      lVar1 = pvVar7->first;
      if (((pvVar7->second).fInTried & 1U) == 0) {
        if (((pvVar7->second).nRefCount < 0) || (8 < (pvVar7->second).nRefCount)) {
          local_20c = -3;
          goto LAB_0088365b;
        }
        if ((pvVar7->second).nRefCount == 0) {
          local_20c = -4;
          goto LAB_0088365b;
        }
        iVar5 = (pvVar7->second).nRefCount;
        pmVar13 = std::
                  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                  ::operator[]((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                                *)in_stack_fffffffffffffc88.__d.__r,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        *pmVar13 = iVar5;
        CNetAddr::GetNetwork
                  ((CNetAddr *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        pmVar17 = std::
                  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                  ::operator[]((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                                *)in_stack_fffffffffffffc88.__d.__r,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        pmVar17->n_new = pmVar17->n_new + 1;
      }
      else {
        rVar8 = TicksSinceEpoch<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                          (in_stack_fffffffffffffc88);
        if (rVar8 == 0) {
          local_20c = -1;
          goto LAB_0088365b;
        }
        if ((pvVar7->second).nRefCount != 0) {
          local_20c = -2;
          goto LAB_0088365b;
        }
        pVar18 = std::
                 unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
                 insert((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                         *)in_stack_fffffffffffffc88.__d.__r,
                        (value_type *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80))
        ;
        local_b8._M_cur = (__node_type *)pVar18.first.super__Node_iterator_base<long,_false>._M_cur;
        local_b0 = pVar18.second;
        CNetAddr::GetNetwork
                  ((CNetAddr *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        pmVar17 = std::
                  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                  ::operator[]((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                                *)in_stack_fffffffffffffc88.__d.__r,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        pmVar17->n_tried = pmVar17->n_tried + 1;
      }
      std::
      unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
      ::find((unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
              *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
             (key_type *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      std::
      unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
      ::end((unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
             *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
      bVar4 = std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_CService,_long>,_false> *)
                         in_stack_fffffffffffffc88.__d.__r,
                         (_Node_iterator_base<std::pair<const_CService,_long>,_false> *)
                         CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
      bVar2 = true;
      if (!bVar4) {
        pvVar9 = std::__detail::_Node_const_iterator<std::pair<const_CService,_long>,_false,_false>
                 ::operator->((_Node_const_iterator<std::pair<const_CService,_long>,_false,_false> *
                              )CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        bVar2 = pvVar9->second != lVar1;
      }
      if (bVar2) {
        local_20c = -5;
        goto LAB_0088365b;
      }
      if ((((pvVar7->second).nRandomPos < 0) ||
          (iVar5 = (pvVar7->second).nRandomPos,
          sVar6 = std::vector<long,_std::allocator<long>_>::size
                            ((vector<long,_std::allocator<long>_> *)
                             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)),
          sVar6 <= (ulong)(long)iVar5)) ||
         (pvVar10 = std::vector<long,_std::allocator<long>_>::operator[]
                              ((vector<long,_std::allocator<long>_> *)
                               in_stack_fffffffffffffc88.__d.__r,
                               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)),
         *pvVar10 != lVar1)) {
        local_20c = -0xe;
        goto LAB_0088365b;
      }
      in_stack_fffffffffffffd08 = &(pvVar7->second).m_last_try;
      in_stack_fffffffffffffd10 = s<(char)48>();
      std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::
      time_point((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),(duration *)0x882d92)
      ;
      sVar3 = std::chrono::
              operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                        ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                         (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      in_stack_fffffffffffffd07 = sVar3;
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                 (__unspec *)0x882dd1);
      bVar2 = std::operator<(sVar3._M_value);
      if (bVar2) {
        local_20c = -6;
        goto LAB_0088365b;
      }
      in_stack_fffffffffffffcf8 = s<(char)48>();
      std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::
      time_point((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),(duration *)0x882e44)
      ;
      sVar3 = std::chrono::
              operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                        ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                         (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                 (__unspec *)0x882e7a);
      bVar2 = std::operator<(sVar3._M_value);
      if (bVar2) {
        local_20c = -8;
        goto LAB_0088365b;
      }
      std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::operator++
                ((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    }
    sVar11 = std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
             size((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                   *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    if (sVar11 == (long)*(int *)(in_RDI + 0x170)) {
      sVar12 = std::
               unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
               ::size((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                       *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      if (sVar12 == (long)*(int *)(in_RDI + 0x20178)) {
        for (local_248 = 0; local_248 < 0x100; local_248 = local_248 + 1) {
          for (local_24c = 0; fNew = (undefined1)((uint)in_stack_fffffffffffffccc >> 0x18),
              local_24c < 0x40; local_24c = local_24c + 1) {
            if (*(long *)(in_RDI + 0x178 + (long)local_248 * 0x200 + (long)local_24c * 8) != -1) {
              sVar11 = std::
                       unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       ::count((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                                *)in_stack_fffffffffffffc88.__d.__r,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
              if (sVar11 == 0) {
                local_20c = -0xb;
                goto LAB_0088365b;
              }
              in_stack_fffffffffffffcd8._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                   ::find((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                           *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                          (key_type *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78))
              ;
              std::
              unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
              ::end((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                     *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
              bVar2 = std::__detail::operator==
                                ((_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                                 in_stack_fffffffffffffc88.__d.__r,
                                 (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
              in_stack_fffffffffffffcd4 = CONCAT13(1,(int3)in_stack_fffffffffffffcd4);
              if (!bVar2) {
                std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
                operator->((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                           CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
                in_stack_fffffffffffffcd0 =
                     AddrInfo::GetTriedBucket
                               ((AddrInfo *)in_stack_fffffffffffffd10.__r,
                                (uint256 *)in_stack_fffffffffffffd08,
                                (NetGroupManager *)
                                CONCAT17(in_stack_fffffffffffffd07._M_value,
                                         in_stack_fffffffffffffd00));
                in_stack_fffffffffffffcd4 =
                     CONCAT13(in_stack_fffffffffffffcd0 != local_248,(int3)in_stack_fffffffffffffcd4
                             );
              }
              if ((char)((uint)in_stack_fffffffffffffcd4 >> 0x18) != '\0') {
                local_20c = -0x11;
                goto LAB_0088365b;
              }
              std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
              operator->((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                         CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
              in_stack_fffffffffffffccc =
                   AddrInfo::GetBucketPosition
                             ((AddrInfo *)in_stack_fffffffffffffcd8._M_cur,
                              (uint256 *)
                              CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                              (bool)fNew,(int)((ulong)in_stack_fffffffffffffcf8.__r >> 0x20));
              if (in_stack_fffffffffffffccc != local_24c) {
                local_20c = -0x12;
                goto LAB_0088365b;
              }
              std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              ::erase((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       *)in_stack_fffffffffffffc88.__d.__r,
                      (key_type *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
            }
          }
        }
        for (local_250 = 0; local_250 < 0x400; local_250 = local_250 + 1) {
          for (local_254 = 0; local_254 < 0x40; local_254 = local_254 + 1) {
            if (*(long *)(in_RDI + 0x20180 + (long)local_250 * 0x200 + (long)local_254 * 8) != -1) {
              sVar12 = std::
                       unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                       ::count((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                                *)in_stack_fffffffffffffc88.__d.__r,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
              if (sVar12 == 0) {
                local_20c = -0xc;
                goto LAB_0088365b;
              }
              std::
              unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
              ::find((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                      *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     (key_type *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
              std::
              unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
              ::end((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                     *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
              bVar4 = std::__detail::operator==
                                ((_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                                 in_stack_fffffffffffffc88.__d.__r,
                                 (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
              bVar2 = true;
              if (!bVar4) {
                std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
                operator->((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                           CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
                iVar5 = AddrInfo::GetBucketPosition
                                  ((AddrInfo *)in_stack_fffffffffffffcd8._M_cur,
                                   (uint256 *)
                                   CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                                   SUB41((uint)in_stack_fffffffffffffccc >> 0x18,0),
                                   (int)((ulong)in_stack_fffffffffffffcf8.__r >> 0x20));
                bVar2 = iVar5 != local_254;
              }
              if (bVar2) {
                local_20c = -0x13;
                goto LAB_0088365b;
              }
              pmVar13 = std::
                        unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                        ::operator[]((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                                      *)in_stack_fffffffffffffc88.__d.__r,
                                     (key_type *)
                                     CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
              iVar5 = *pmVar13;
              *pmVar13 = iVar5 + -1;
              if (iVar5 + -1 == 0) {
                std::
                unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                ::erase((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                         *)in_stack_fffffffffffffc88.__d.__r,
                        (key_type *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
              }
            }
          }
        }
        sVar11 = std::
                 unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
                 size((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        if (sVar11 == 0) {
          sVar12 = std::
                   unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                   ::size((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                           *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
          if (sVar12 == 0) {
            bVar2 = base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffffc88.__d.__r);
            if (bVar2) {
              local_20c = -0x10;
            }
            else {
              sVar14 = std::
                       unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                       ::size((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
              sVar15 = std::
                       unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                       ::size((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
              if (sVar14 < sVar15) {
                local_20c = -0x14;
              }
              else {
                std::
                unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                ::begin((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                         *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
                std::
                unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                ::end((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                       *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
                while (bVar2 = std::__detail::operator==
                                         ((_Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                                           *)in_stack_fffffffffffffc88.__d.__r,
                                          (_Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                                           *)CONCAT44(in_stack_fffffffffffffc84,
                                                      in_stack_fffffffffffffc80)),
                      ((bVar2 ^ 0xffU) & 1) != 0) {
                  std::__detail::
                  _Node_const_iterator<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false,_false>
                  ::operator*((_Node_const_iterator<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false,_false>
                               *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
                  std::get<0ul,Network_const,AddrManImpl::NewTriedCount>
                            ((pair<const_Network,_AddrManImpl::NewTriedCount> *)
                             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
                  ptVar16 = std::get<1ul,Network_const,AddrManImpl::NewTriedCount>
                                      ((pair<const_Network,_AddrManImpl::NewTriedCount> *)
                                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
                                      );
                  pmVar17 = std::
                            unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                            ::operator[]((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                                          *)in_stack_fffffffffffffc88.__d.__r,
                                         (key_type *)
                                         CONCAT44(in_stack_fffffffffffffc84,
                                                  in_stack_fffffffffffffc80));
                  if ((pmVar17->n_new != ptVar16->n_new) ||
                     (in_stack_fffffffffffffc88.__d.__r =
                           (duration)
                           std::
                           unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                           ::operator[]((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                                         *)in_stack_fffffffffffffc88.__d.__r,
                                        (key_type *)
                                        CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80
                                                )),
                     ((mapped_type *)in_stack_fffffffffffffc88.__d.__r)->n_tried != ptVar16->n_tried
                     )) {
                    local_20c = -0x15;
                    goto LAB_0088365b;
                  }
                  std::__detail::
                  _Node_const_iterator<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false,_false>
                  ::operator++((_Node_const_iterator<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false,_false>
                                *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
                }
                local_20c = 0;
              }
            }
          }
          else {
            local_20c = -0xf;
          }
        }
        else {
          local_20c = -0xd;
        }
      }
      else {
        local_20c = -10;
      }
    }
    else {
      local_20c = -9;
    }
  }
  else {
    local_20c = -7;
  }
LAB_0088365b:
  std::
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  ::~unordered_map((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  ::~unordered_map((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *
                 )CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
            ((Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_20c;
}

Assistant:

int AddrManImpl::CheckAddrman() const
{
    AssertLockHeld(cs);

    LOG_TIME_MILLIS_WITH_CATEGORY_MSG_ONCE(
        strprintf("new %i, tried %i, total %u", nNew, nTried, vRandom.size()), BCLog::ADDRMAN);

    std::unordered_set<nid_type> setTried;
    std::unordered_map<nid_type, int> mapNew;
    std::unordered_map<Network, NewTriedCount> local_counts;

    if (vRandom.size() != (size_t)(nTried + nNew))
        return -7;

    for (const auto& entry : mapInfo) {
        nid_type n = entry.first;
        const AddrInfo& info = entry.second;
        if (info.fInTried) {
            if (!TicksSinceEpoch<std::chrono::seconds>(info.m_last_success)) {
                return -1;
            }
            if (info.nRefCount)
                return -2;
            setTried.insert(n);
            local_counts[info.GetNetwork()].n_tried++;
        } else {
            if (info.nRefCount < 0 || info.nRefCount > ADDRMAN_NEW_BUCKETS_PER_ADDRESS)
                return -3;
            if (!info.nRefCount)
                return -4;
            mapNew[n] = info.nRefCount;
            local_counts[info.GetNetwork()].n_new++;
        }
        const auto it{mapAddr.find(info)};
        if (it == mapAddr.end() || it->second != n) {
            return -5;
        }
        if (info.nRandomPos < 0 || (size_t)info.nRandomPos >= vRandom.size() || vRandom[info.nRandomPos] != n)
            return -14;
        if (info.m_last_try < NodeSeconds{0s}) {
            return -6;
        }
        if (info.m_last_success < NodeSeconds{0s}) {
            return -8;
        }
    }

    if (setTried.size() != (size_t)nTried)
        return -9;
    if (mapNew.size() != (size_t)nNew)
        return -10;

    for (int n = 0; n < ADDRMAN_TRIED_BUCKET_COUNT; n++) {
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvTried[n][i] != -1) {
                if (!setTried.count(vvTried[n][i]))
                    return -11;
                const auto it{mapInfo.find(vvTried[n][i])};
                if (it == mapInfo.end() || it->second.GetTriedBucket(nKey, m_netgroupman) != n) {
                    return -17;
                }
                if (it->second.GetBucketPosition(nKey, false, n) != i) {
                    return -18;
                }
                setTried.erase(vvTried[n][i]);
            }
        }
    }

    for (int n = 0; n < ADDRMAN_NEW_BUCKET_COUNT; n++) {
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvNew[n][i] != -1) {
                if (!mapNew.count(vvNew[n][i]))
                    return -12;
                const auto it{mapInfo.find(vvNew[n][i])};
                if (it == mapInfo.end() || it->second.GetBucketPosition(nKey, true, n) != i) {
                    return -19;
                }
                if (--mapNew[vvNew[n][i]] == 0)
                    mapNew.erase(vvNew[n][i]);
            }
        }
    }

    if (setTried.size())
        return -13;
    if (mapNew.size())
        return -15;
    if (nKey.IsNull())
        return -16;

    // It's possible that m_network_counts may have all-zero entries that local_counts
    // doesn't have if addrs from a network were being added and then removed again in the past.
    if (m_network_counts.size() < local_counts.size()) {
        return -20;
    }
    for (const auto& [net, count] : m_network_counts) {
        if (local_counts[net].n_new != count.n_new || local_counts[net].n_tried != count.n_tried) {
            return -21;
        }
    }

    return 0;
}